

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  code *pcVar1;
  long lVar2;
  _Alloc_hider _Var3;
  Result RVar4;
  Result RVar5;
  Result RVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  wabt *this;
  long *plVar8;
  size_t sVar9;
  undefined8 callback;
  long *plVar10;
  ulong uVar11;
  uint uVar13;
  Module *out_module;
  bool bVar14;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  ValidateOptions options_1;
  string header_name_full;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  size_type __dnew;
  OptionParser parser;
  ReadBinaryOptions options;
  _Any_data local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [3];
  long *local_488;
  size_t local_480;
  long local_478;
  long lStack_470;
  void *local_468;
  long lStack_460;
  long local_458;
  Errors local_448;
  _Any_data local_428;
  code *local_418;
  code *local_410;
  Stream *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [92];
  Index IStack_36c;
  Index IStack_368;
  undefined8 uStack_364;
  undefined1 local_358 [16];
  pointer local_348;
  __node_base_ptr *local_250;
  size_type local_248;
  __node_base local_240;
  size_type sStack_238;
  float local_230;
  size_t local_228;
  __node_base_ptr p_Stack_220;
  __node_base_ptr *local_218;
  size_type local_210;
  __node_base local_208;
  size_type sStack_200;
  float local_1f8;
  size_t local_1f0;
  __node_base_ptr p_Stack_1e8;
  __node_base_ptr *local_1e0;
  size_type local_1d8;
  __node_base local_1d0;
  size_type sStack_1c8;
  float local_1c0;
  size_t local_1b8;
  __node_base_ptr p_Stack_1b0;
  __node_base_ptr *local_1a8;
  size_type local_1a0;
  __node_base local_198;
  size_type sStack_190;
  float local_188;
  size_t local_180;
  __node_base_ptr p_Stack_178;
  __node_base_ptr *local_170;
  size_type local_168;
  __node_base local_160;
  size_type sStack_158;
  float local_150;
  size_t local_148;
  __node_base_ptr p_Stack_140;
  __node_base_ptr *local_138;
  size_type local_130;
  __node_base local_128;
  size_type sStack_120;
  float local_118;
  size_t local_110;
  __node_base_ptr p_Stack_108;
  __node_base_ptr *local_100;
  size_type local_f8;
  __node_base local_f0;
  size_type sStack_e8;
  float local_e0;
  size_t local_d8;
  __node_base_ptr p_Stack_d0;
  __node_base_ptr *local_c8;
  size_type local_c0;
  __node_base local_b8;
  size_type sStack_b0;
  float local_a8;
  size_t local_a0;
  __node_base_ptr p_Stack_98;
  __node_base_ptr *local_90;
  size_type local_88;
  __node_base local_80;
  size_type sStack_78;
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  ReadBinaryOptions local_58;
  size_type sVar12;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_3c8,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8[0]._M_local_buf[8] = -0x22;
  local_4b8[0]._M_local_buf[9] = 'O';
  local_4b8[0]._M_local_buf[10] = '\x11';
  local_4b8[0]._M_local_buf[0xb] = '\0';
  local_4b8[0]._M_local_buf[0xc] = '\0';
  local_4b8[0]._M_local_buf[0xd] = '\0';
  local_4b8[0]._M_local_buf[0xe] = '\0';
  local_4b8[0]._M_local_buf[0xf] = '\0';
  local_4b8[0]._M_local_buf[0] = '0';
  local_4b8[0]._M_local_buf[1] = 'P';
  local_4b8[0]._M_local_buf[2] = '\x11';
  local_4b8[0]._M_local_buf[3] = '\0';
  local_4b8[0]._M_local_buf[4] = '\0';
  local_4b8[0]._M_local_buf[5] = '\0';
  local_4b8[0]._M_local_buf[6] = '\0';
  local_4b8[0]._M_local_buf[7] = '\0';
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_4c8);
  pcVar1 = (code *)CONCAT17(local_4b8[0]._M_local_buf[7],
                            CONCAT16(local_4b8[0]._M_local_buf[6],
                                     CONCAT15(local_4b8[0]._M_local_buf[5],
                                              CONCAT14(local_4b8[0]._M_local_buf[4],
                                                       CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                CONCAT12(local_4b8[0]._M_local_buf
                                                                         [2],CONCAT11(local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [1],local_4b8[
                                                  0]._M_local_buf[0])))))));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4c8,&local_4c8,3);
  }
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8[0]._M_local_buf[8] = 'H';
  local_4b8[0]._M_local_buf[9] = 'P';
  local_4b8[0]._M_local_buf[10] = '\x11';
  local_4b8[0]._M_local_buf[0xb] = '\0';
  local_4b8[0]._M_local_buf[0xc] = '\0';
  local_4b8[0]._M_local_buf[0xd] = '\0';
  local_4b8[0]._M_local_buf[0xe] = '\0';
  local_4b8[0]._M_local_buf[0xf] = '\0';
  local_4b8[0]._M_local_buf[0] = -0x5a;
  local_4b8[0]._M_local_buf[1] = 'P';
  local_4b8[0]._M_local_buf[2] = '\x11';
  local_4b8[0]._M_local_buf[3] = '\0';
  local_4b8[0]._M_local_buf[4] = '\0';
  local_4b8[0]._M_local_buf[5] = '\0';
  local_4b8[0]._M_local_buf[6] = '\0';
  local_4b8[0]._M_local_buf[7] = '\0';
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",
             (Callback *)&local_4c8);
  pcVar1 = (code *)CONCAT17(local_4b8[0]._M_local_buf[7],
                            CONCAT16(local_4b8[0]._M_local_buf[6],
                                     CONCAT15(local_4b8[0]._M_local_buf[5],
                                              CONCAT14(local_4b8[0]._M_local_buf[4],
                                                       CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                CONCAT12(local_4b8[0]._M_local_buf
                                                                         [2],CONCAT11(local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [1],local_4b8[
                                                  0]._M_local_buf[0])))))));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4c8,&local_4c8,3);
  }
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8[0]._M_local_buf[8] = -0x42;
  local_4b8[0]._M_local_buf[9] = 'P';
  local_4b8[0]._M_local_buf[10] = '\x11';
  local_4b8[0]._M_local_buf[0xb] = '\0';
  local_4b8[0]._M_local_buf[0xc] = '\0';
  local_4b8[0]._M_local_buf[0xd] = '\0';
  local_4b8[0]._M_local_buf[0xe] = '\0';
  local_4b8[0]._M_local_buf[0xf] = '\0';
  local_4b8[0]._M_local_buf[0] = -0x26;
  local_4b8[0]._M_local_buf[1] = 'P';
  local_4b8[0]._M_local_buf[2] = '\x11';
  local_4b8[0]._M_local_buf[3] = '\0';
  local_4b8[0]._M_local_buf[4] = '\0';
  local_4b8[0]._M_local_buf[5] = '\0';
  local_4b8[0]._M_local_buf[6] = '\0';
  local_4b8[0]._M_local_buf[7] = '\0';
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'n',"module-name","MODNAME",
             "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
             ,(Callback *)&local_4c8);
  pcVar1 = (code *)CONCAT17(local_4b8[0]._M_local_buf[7],
                            CONCAT16(local_4b8[0]._M_local_buf[6],
                                     CONCAT15(local_4b8[0]._M_local_buf[5],
                                              CONCAT14(local_4b8[0]._M_local_buf[4],
                                                       CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                CONCAT12(local_4b8[0]._M_local_buf
                                                                         [2],CONCAT11(local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [1],local_4b8[
                                                  0]._M_local_buf[0])))))));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4c8,&local_4c8,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_3c8);
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8[0]._M_local_buf[8] = -0xe;
  local_4b8[0]._M_local_buf[9] = 'P';
  local_4b8[0]._M_local_buf[10] = '\x11';
  local_4b8[0]._M_local_buf[0xb] = '\0';
  local_4b8[0]._M_local_buf[0xc] = '\0';
  local_4b8[0]._M_local_buf[0xd] = '\0';
  local_4b8[0]._M_local_buf[0xe] = '\0';
  local_4b8[0]._M_local_buf[0xf] = '\0';
  local_4b8[0]._M_local_buf[0] = -6;
  local_4b8[0]._M_local_buf[1] = 'P';
  local_4b8[0]._M_local_buf[2] = '\x11';
  local_4b8[0]._M_local_buf[3] = '\0';
  local_4b8[0]._M_local_buf[4] = '\0';
  local_4b8[0]._M_local_buf[5] = '\0';
  local_4b8[0]._M_local_buf[6] = '\0';
  local_4b8[0]._M_local_buf[7] = '\0';
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&local_4c8);
  pcVar1 = (code *)CONCAT17(local_4b8[0]._M_local_buf[7],
                            CONCAT16(local_4b8[0]._M_local_buf[6],
                                     CONCAT15(local_4b8[0]._M_local_buf[5],
                                              CONCAT14(local_4b8[0]._M_local_buf[4],
                                                       CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                CONCAT12(local_4b8[0]._M_local_buf
                                                                         [2],CONCAT11(local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [1],local_4b8[
                                                  0]._M_local_buf[0])))))));
  if (pcVar1 != (code *)0x0) {
    (*pcVar1)(&local_4c8,&local_4c8,3);
  }
  local_4b8[0]._M_local_buf[0] = 'f';
  local_4b8[0]._M_local_buf[1] = 'i';
  local_4b8[0]._M_local_buf[2] = 'l';
  local_4b8[0]._M_local_buf[3] = 'e';
  local_4b8[0]._M_local_buf[4] = 'n';
  local_4b8[0]._M_local_buf[5] = 'a';
  local_4b8[0]._M_local_buf[6] = 'm';
  local_4b8[0]._M_local_buf[7] = 'e';
  local_4c8._8_8_ = (_Any_data *)0x8;
  local_4b8[0]._M_local_buf[8] = '\0';
  callback = &local_428;
  local_428._M_unused._M_object = (_Any_data *)0x0;
  local_428._8_8_ = 0;
  local_410 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
              ::_M_invoke;
  local_418 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
              ::_M_manager;
  local_4c8._M_unused._M_object = local_4b8;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_3c8,(string *)&local_4c8,One,(Callback *)callback);
  if (local_418 != (code *)0x0) {
    (*local_418)(&local_428,&local_428,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_unused._0_8_ != local_4b8) {
    operator_delete(local_4c8._M_unused._M_object,
                    CONCAT17(local_4b8[0]._M_local_buf[7],
                             CONCAT16(local_4b8[0]._M_local_buf[6],
                                      CONCAT15(local_4b8[0]._M_local_buf[5],
                                               CONCAT14(local_4b8[0]._M_local_buf[4],
                                                        CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                 CONCAT12(local_4b8[0]._M_local_buf
                                                                          [2],CONCAT11(local_4b8[0].
                                                                                       _M_local_buf
                                                                                       [1],local_4b8
                                                  [0]._M_local_buf[0]))))))) + 1);
  }
  wabt::OptionParser::Parse((OptionParser *)local_3c8,argc,argv);
  bVar14 = false;
  if (s_features.exceptions_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'e';
    local_4b8[0]._M_local_buf[1] = 'x';
    local_4b8[0]._M_local_buf[2] = 'c';
    local_4b8[0]._M_local_buf[3] = 'e';
    local_4b8[0]._M_local_buf[4] = 'p';
    local_4b8[0]._M_local_buf[5] = 't';
    local_4b8[0]._M_local_buf[6] = 'i';
    local_4b8[0]._M_local_buf[7] = 'o';
    local_4b8[0]._M_local_buf[8] = 'n';
    local_4b8[0]._M_local_buf[9] = 's';
    local_4c8._8_8_ = (_Any_data *)0xa;
    local_4b8[0]._M_local_buf[10] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    bVar14 = pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
  }
  if (s_features.mutable_globals_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 'm';
    local_4b8[0]._M_local_buf[1] = 'u';
    local_4b8[0]._M_local_buf[2] = 't';
    local_4b8[0]._M_local_buf[3] = 'a';
    local_4b8[0]._M_local_buf[4] = 'b';
    local_4b8[0]._M_local_buf[5] = 'l';
    local_4b8[0]._M_local_buf[6] = 'e';
    local_4b8[0]._M_local_buf[7] = '-';
    local_4b8[0]._M_local_buf[8] = 'g';
    local_4b8[0]._M_local_buf[9] = 'l';
    local_4b8[0]._M_local_buf[10] = 'o';
    local_4b8[0]._M_local_buf[0xb] = 'b';
    local_4b8[0]._M_local_buf[0xc] = 'a';
    local_4b8[0]._M_local_buf[0xd] = 'l';
    local_4b8[0]._M_local_buf[0xe] = 's';
    local_4c8._8_8_ = (_Any_data *)0xf;
    local_4b8[0]._M_local_buf[0xf] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.sat_float_to_int_enabled_ == false) {
    local_428._M_unused._M_member_pointer = 0x17;
    local_4c8._M_unused._M_object = local_4b8;
    local_4c8._M_unused._0_8_ =
         (undefined8)
         std::__cxx11::string::_M_create((ulong *)local_4c8._M_pod_data,(ulong)&local_428);
    local_4b8[0]._M_local_buf[0] = (undefined1)local_428._M_unused._M_member_pointer;
    local_4b8[0]._M_local_buf[1] = (undefined1)((ulong)local_428._0_8_ >> 8);
    local_4b8[0]._M_local_buf[2] = (undefined1)((ulong)local_428._0_8_ >> 0x10);
    local_4b8[0]._M_local_buf[3] = (undefined1)((ulong)local_428._0_8_ >> 0x18);
    local_4b8[0]._M_local_buf[4] = (undefined1)((ulong)local_428._0_8_ >> 0x20);
    local_4b8[0]._M_local_buf[5] = (undefined1)((ulong)local_428._0_8_ >> 0x28);
    local_4b8[0]._M_local_buf[6] = (undefined1)((ulong)local_428._0_8_ >> 0x30);
    local_4b8[0]._M_local_buf[7] = (undefined1)((ulong)local_428._0_8_ >> 0x38);
    *(undefined4 *)local_4c8._M_unused._0_8_ = 0x75746173;
    *(char *)((long)local_4c8._M_unused._0_8_ + 4) = 'r';
    *(char *)((long)local_4c8._M_unused._0_8_ + 5) = 'a';
    *(char *)((long)local_4c8._M_unused._0_8_ + 6) = 't';
    *(char *)((long)local_4c8._M_unused._0_8_ + 7) = 'i';
    *(char *)((long)local_4c8._M_unused._0_8_ + 8) = 'n';
    *(char *)((long)local_4c8._M_unused._0_8_ + 9) = 'g';
    *(char *)((long)local_4c8._M_unused._0_8_ + 10) = '-';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xb) = 'f';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xc) = 'l';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xd) = 'o';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xe) = 'a';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xf) = 't';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xf) = 't';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x10) = '-';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x11) = 't';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x12) = 'o';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x13) = '-';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x14) = 'i';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x15) = 'n';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x16) = 't';
    local_4c8._8_8_ = local_428._M_unused._M_object;
    *(char *)((long)local_4c8._M_unused._0_8_ + (long)local_428._M_unused._0_8_) = '\0';
    callback = local_428._M_unused._0_8_;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.sign_extension_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 's';
    local_4b8[0]._M_local_buf[1] = 'i';
    local_4b8[0]._M_local_buf[2] = 'g';
    local_4b8[0]._M_local_buf[3] = 'n';
    local_4b8[0]._M_local_buf[4] = '-';
    local_4b8[0]._M_local_buf[5] = 'e';
    local_4b8[0]._M_local_buf[6] = 'x';
    local_4b8[0]._M_local_buf[7] = 't';
    local_4b8[0]._M_local_buf[8] = 'e';
    local_4b8[0]._M_local_buf[9] = 'n';
    local_4b8[0]._M_local_buf[10] = 's';
    local_4b8[0]._M_local_buf[0xb] = 'i';
    local_4b8[0]._M_local_buf[0xc] = 'o';
    local_4b8[0]._M_local_buf[0xd] = 'n';
    local_4c8._8_8_ = (_Any_data *)0xe;
    local_4b8[0]._M_local_buf[0xe] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.simd_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 's';
    local_4b8[0]._M_local_buf[1] = 'i';
    local_4b8[0]._M_local_buf[2] = 'm';
    local_4b8[0]._M_local_buf[3] = 'd';
    local_4c8._8_8_ = (_Any_data *)0x4;
    local_4b8[0]._M_local_buf[4] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.threads_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 't';
    local_4b8[0]._M_local_buf[1] = 'h';
    local_4b8[0]._M_local_buf[2] = 'r';
    local_4b8[0]._M_local_buf[3] = 'e';
    local_4b8[0]._M_local_buf[4] = 'a';
    local_4b8[0]._M_local_buf[5] = 'd';
    local_4b8[0]._M_local_buf[6] = 's';
    local_4c8._8_8_ = (_Any_data *)0x7;
    local_4b8[0]._M_local_buf[7] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.function_references_enabled_ == true) {
    local_428._M_unused._M_member_pointer = 0x13;
    local_4c8._M_unused._M_object = local_4b8;
    local_4c8._M_unused._0_8_ =
         (undefined8)
         std::__cxx11::string::_M_create((ulong *)local_4c8._M_pod_data,(ulong)&local_428);
    local_4b8[0]._M_local_buf[0] = (undefined1)local_428._M_unused._M_member_pointer;
    local_4b8[0]._M_local_buf[1] = (undefined1)((ulong)local_428._0_8_ >> 8);
    local_4b8[0]._M_local_buf[2] = (undefined1)((ulong)local_428._0_8_ >> 0x10);
    local_4b8[0]._M_local_buf[3] = (undefined1)((ulong)local_428._0_8_ >> 0x18);
    local_4b8[0]._M_local_buf[4] = (undefined1)((ulong)local_428._0_8_ >> 0x20);
    local_4b8[0]._M_local_buf[5] = (undefined1)((ulong)local_428._0_8_ >> 0x28);
    local_4b8[0]._M_local_buf[6] = (undefined1)((ulong)local_428._0_8_ >> 0x30);
    local_4b8[0]._M_local_buf[7] = (undefined1)((ulong)local_428._0_8_ >> 0x38);
    *(undefined4 *)local_4c8._M_unused._0_8_ = 0x636e7566;
    *(char *)((long)local_4c8._M_unused._0_8_ + 4) = 't';
    *(char *)((long)local_4c8._M_unused._0_8_ + 5) = 'i';
    *(char *)((long)local_4c8._M_unused._0_8_ + 6) = 'o';
    *(char *)((long)local_4c8._M_unused._0_8_ + 7) = 'n';
    *(char *)((long)local_4c8._M_unused._0_8_ + 8) = '-';
    *(char *)((long)local_4c8._M_unused._0_8_ + 9) = 'r';
    *(char *)((long)local_4c8._M_unused._0_8_ + 10) = 'e';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xb) = 'f';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xc) = 'e';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xd) = 'r';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xe) = 'e';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xf) = 'n';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0xf) = 'n';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x10) = 'c';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x11) = 'e';
    *(char *)((long)local_4c8._M_unused._0_8_ + 0x12) = 's';
    local_4c8._8_8_ = local_428._M_unused._M_object;
    *(char *)((long)local_4c8._M_unused._0_8_ + (long)local_428._M_unused._0_8_) = '\0';
    callback = local_428._M_unused._0_8_;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.multi_value_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 'm';
    local_4b8[0]._M_local_buf[1] = 'u';
    local_4b8[0]._M_local_buf[2] = 'l';
    local_4b8[0]._M_local_buf[3] = 't';
    local_4b8[0]._M_local_buf[4] = 'i';
    local_4b8[0]._M_local_buf[5] = '-';
    local_4b8[0]._M_local_buf[6] = 'v';
    local_4b8[0]._M_local_buf[7] = 'a';
    local_4b8[0]._M_local_buf[8] = 'l';
    local_4b8[0]._M_local_buf[9] = 'u';
    local_4b8[0]._M_local_buf[10] = 'e';
    local_4c8._8_8_ = (_Any_data *)0xb;
    local_4b8[0]._M_local_buf[0xb] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.tail_call_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 't';
    local_4b8[0]._M_local_buf[1] = 'a';
    local_4b8[0]._M_local_buf[2] = 'i';
    local_4b8[0]._M_local_buf[3] = 'l';
    local_4b8[0]._M_local_buf[4] = '-';
    local_4b8[0]._M_local_buf[5] = 'c';
    local_4b8[0]._M_local_buf[6] = 'a';
    local_4b8[0]._M_local_buf[7] = 'l';
    local_4b8[0]._M_local_buf[8] = 'l';
    local_4b8[0]._M_local_buf[9] = '\0';
    local_4c8._8_8_ = (_Any_data *)0x9;
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.bulk_memory_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 'b';
    local_4b8[0]._M_local_buf[1] = 'u';
    local_4b8[0]._M_local_buf[2] = 'l';
    local_4b8[0]._M_local_buf[3] = 'k';
    local_4b8[0]._M_local_buf[4] = '-';
    local_4b8[0]._M_local_buf[5] = 'm';
    local_4b8[0]._M_local_buf[6] = 'e';
    local_4b8[0]._M_local_buf[7] = 'm';
    local_4b8[0]._M_local_buf[8] = 'o';
    local_4b8[0]._M_local_buf[9] = 'r';
    local_4b8[0]._M_local_buf[10] = 'y';
    local_4c8._8_8_ = (_Any_data *)0xb;
    local_4b8[0]._M_local_buf[0xb] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.reference_types_enabled_ == false) {
    local_4b8[0]._M_local_buf[0] = 'r';
    local_4b8[0]._M_local_buf[1] = 'e';
    local_4b8[0]._M_local_buf[2] = 'f';
    local_4b8[0]._M_local_buf[3] = 'e';
    local_4b8[0]._M_local_buf[4] = 'r';
    local_4b8[0]._M_local_buf[5] = 'e';
    local_4b8[0]._M_local_buf[6] = 'n';
    local_4b8[0]._M_local_buf[7] = 'c';
    local_4b8[0]._M_local_buf[8] = 'e';
    local_4b8[0]._M_local_buf[9] = '-';
    local_4b8[0]._M_local_buf[10] = 't';
    local_4b8[0]._M_local_buf[0xb] = 'y';
    local_4b8[0]._M_local_buf[0xc] = 'p';
    local_4b8[0]._M_local_buf[0xd] = 'e';
    local_4b8[0]._M_local_buf[0xe] = 's';
    local_4c8._8_8_ = (_Any_data *)0xf;
    local_4b8[0]._M_local_buf[0xf] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.annotations_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'a';
    local_4b8[0]._M_local_buf[1] = 'n';
    local_4b8[0]._M_local_buf[2] = 'n';
    local_4b8[0]._M_local_buf[3] = 'o';
    local_4b8[0]._M_local_buf[4] = 't';
    local_4b8[0]._M_local_buf[5] = 'a';
    local_4b8[0]._M_local_buf[6] = 't';
    local_4b8[0]._M_local_buf[7] = 'i';
    local_4b8[0]._M_local_buf[8] = 'o';
    local_4b8[0]._M_local_buf[9] = 'n';
    local_4b8[0]._M_local_buf[10] = 's';
    local_4c8._8_8_ = (_Any_data *)0xb;
    local_4b8[0]._M_local_buf[0xb] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.code_metadata_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'c';
    local_4b8[0]._M_local_buf[1] = 'o';
    local_4b8[0]._M_local_buf[2] = 'd';
    local_4b8[0]._M_local_buf[3] = 'e';
    local_4b8[0]._M_local_buf[4] = '-';
    local_4b8[0]._M_local_buf[5] = 'm';
    local_4b8[0]._M_local_buf[6] = 'e';
    local_4b8[0]._M_local_buf[7] = 't';
    local_4b8[0]._M_local_buf[8] = 'a';
    local_4b8[0]._M_local_buf[9] = 'd';
    local_4b8[0]._M_local_buf[10] = 'a';
    local_4b8[0]._M_local_buf[0xb] = 't';
    local_4b8[0]._M_local_buf[0xc] = 'a';
    local_4c8._8_8_ = (_Any_data *)0xd;
    local_4b8[0]._M_local_buf[0xd] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.gc_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'g';
    local_4b8[0]._M_local_buf[1] = 'c';
    local_4c8._8_8_ = (_Any_data *)0x2;
    local_4b8[0]._M_local_buf[2] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.memory64_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'm';
    local_4b8[0]._M_local_buf[1] = 'e';
    local_4b8[0]._M_local_buf[2] = 'm';
    local_4b8[0]._M_local_buf[3] = 'o';
    local_4b8[0]._M_local_buf[4] = 'r';
    local_4b8[0]._M_local_buf[5] = 'y';
    local_4b8[0]._M_local_buf[6] = '6';
    local_4b8[0]._M_local_buf[7] = '4';
    local_4c8._8_8_ = (_Any_data *)0x8;
    local_4b8[0]._M_local_buf[8] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.multi_memory_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'm';
    local_4b8[0]._M_local_buf[1] = 'u';
    local_4b8[0]._M_local_buf[2] = 'l';
    local_4b8[0]._M_local_buf[3] = 't';
    local_4b8[0]._M_local_buf[4] = 'i';
    local_4b8[0]._M_local_buf[5] = '-';
    local_4b8[0]._M_local_buf[6] = 'm';
    local_4b8[0]._M_local_buf[7] = 'e';
    local_4b8[0]._M_local_buf[8] = 'm';
    local_4b8[0]._M_local_buf[9] = 'o';
    local_4b8[0]._M_local_buf[10] = 'r';
    local_4b8[0]._M_local_buf[0xb] = 'y';
    local_4c8._8_8_ = (_Any_data *)0xc;
    local_4b8[0]._M_local_buf[0xc] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.extended_const_enabled_ == true) {
    local_4b8[0]._M_local_buf[0] = 'e';
    local_4b8[0]._M_local_buf[1] = 'x';
    local_4b8[0]._M_local_buf[2] = 't';
    local_4b8[0]._M_local_buf[3] = 'e';
    local_4b8[0]._M_local_buf[4] = 'n';
    local_4b8[0]._M_local_buf[5] = 'd';
    local_4b8[0]._M_local_buf[6] = 'e';
    local_4b8[0]._M_local_buf[7] = 'd';
    local_4b8[0]._M_local_buf[8] = '-';
    local_4b8[0]._M_local_buf[9] = 'c';
    local_4b8[0]._M_local_buf[10] = 'o';
    local_4b8[0]._M_local_buf[0xb] = 'n';
    local_4b8[0]._M_local_buf[0xc] = 's';
    local_4b8[0]._M_local_buf[0xd] = 't';
    local_4c8._8_8_ = (_Any_data *)0xe;
    local_4b8[0]._M_local_buf[0xe] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
  }
  if (s_features.relaxed_simd_enabled_ != false) {
    local_4b8[0]._M_local_buf[0] = 'r';
    local_4b8[0]._M_local_buf[1] = 'e';
    local_4b8[0]._M_local_buf[2] = 'l';
    local_4b8[0]._M_local_buf[3] = 'a';
    local_4b8[0]._M_local_buf[4] = 'x';
    local_4b8[0]._M_local_buf[5] = 'e';
    local_4b8[0]._M_local_buf[6] = 'd';
    local_4b8[0]._M_local_buf[7] = '-';
    local_4b8[0]._M_local_buf[8] = 's';
    local_4b8[0]._M_local_buf[9] = 'i';
    local_4b8[0]._M_local_buf[10] = 'm';
    local_4b8[0]._M_local_buf[0xb] = 'd';
    local_4c8._8_8_ = (_Any_data *)0xc;
    local_4b8[0]._M_local_buf[0xc] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    pbVar7 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    bVar14 = (bool)(bVar14 | pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&s_read_debug_names);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
  }
  if (bVar14) {
    ProgramMain();
LAB_00114fc3:
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  if (local_348 != (pointer)0x0) {
    (*(code *)local_348)(local_358,local_358,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_3c8 + 0x58));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             (local_3c8 + 0x40));
  if ((undefined1 *)local_3c8._32_8_ != local_3c8 + 0x30) {
    operator_delete((void *)local_3c8._32_8_,CONCAT71(local_3c8._49_7_,local_3c8[0x30]) + 1);
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,CONCAT44(local_3c8._20_4_,local_3c8._16_4_) + 1);
  }
  _Var3._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  local_468 = (void *)0x0;
  lStack_460 = 0;
  local_458 = 0;
  this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  sVar15._M_str = (char *)&local_468;
  sVar15._M_len = (size_t)_Var3._M_p;
  RVar4 = wabt::ReadFile(this,sVar15,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  uVar13 = 1;
  if (RVar4.enum_ == Ok) {
    local_448.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8._16_4_ = 0;
    local_3c8._20_4_ = 0;
    local_3c8._24_4_ = 0;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_4_ = 0;
    local_3c8._12_4_ = 0;
    local_3c8._40_8_ = 0;
    local_3c8[0x30] = '\0';
    local_3c8._64_8_ = (pointer)0x0;
    local_3c8._72_8_ = (pointer)0x0;
    local_3c8._80_8_ = (pointer)0x0;
    local_3c8._88_4_ = 0;
    IStack_36c = 0;
    IStack_368 = 0;
    uStack_364 = 0;
    local_3c8._32_8_ = local_3c8 + 0x30;
    memset(local_358,0,0x108);
    local_248 = 1;
    local_240._M_nxt = (_Hash_node_base *)0x0;
    sStack_238 = 0;
    local_230 = 1.0;
    local_228 = 0;
    p_Stack_220 = (__node_base_ptr)0x0;
    local_218 = &p_Stack_1e8;
    local_210 = 1;
    local_208._M_nxt = (_Hash_node_base *)0x0;
    sStack_200 = 0;
    local_1f8 = 1.0;
    local_1f0 = 0;
    p_Stack_1e8 = (__node_base_ptr)0x0;
    local_1e0 = &p_Stack_1b0;
    local_1d8 = 1;
    local_1d0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1c8 = 0;
    local_1c0 = 1.0;
    local_1b8 = 0;
    p_Stack_1b0 = (__node_base_ptr)0x0;
    local_1a8 = &p_Stack_178;
    local_1a0 = 1;
    local_198._M_nxt = (_Hash_node_base *)0x0;
    sStack_190 = 0;
    local_188 = 1.0;
    local_180 = 0;
    p_Stack_178 = (__node_base_ptr)0x0;
    local_170 = &p_Stack_140;
    local_168 = 1;
    local_160._M_nxt = (_Hash_node_base *)0x0;
    sStack_158 = 0;
    local_150 = 1.0;
    local_148 = 0;
    p_Stack_140 = (__node_base_ptr)0x0;
    local_138 = &p_Stack_108;
    local_130 = 1;
    local_128._M_nxt = (_Hash_node_base *)0x0;
    sStack_120 = 0;
    local_118 = 1.0;
    local_110 = 0;
    p_Stack_108 = (__node_base_ptr)0x0;
    local_100 = &p_Stack_d0;
    local_f8 = 1;
    local_f0._M_nxt = (_Hash_node_base *)0x0;
    sStack_e8 = 0;
    local_e0 = 1.0;
    local_d8 = 0;
    p_Stack_d0 = (__node_base_ptr)0x0;
    local_c8 = &p_Stack_98;
    local_c0 = 1;
    local_b8._M_nxt = (_Hash_node_base *)0x0;
    sStack_b0 = 0;
    local_a8 = 1.0;
    local_a0 = 0;
    p_Stack_98 = (__node_base_ptr)0x0;
    local_90 = &p_Stack_60;
    local_88 = 1;
    local_80._M_nxt = (_Hash_node_base *)0x0;
    sStack_78 = 0;
    local_70 = 1.0;
    local_68 = 0;
    p_Stack_60 = (__node_base_ptr)0x0;
    local_58.read_debug_names = (bool)(s_read_debug_names ^ 1);
    local_58.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_58.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_58.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_58.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_58.features.simd_enabled_ = s_features.simd_enabled_;
    local_58.features.threads_enabled_ = s_features.threads_enabled_;
    local_58.features.function_references_enabled_ = s_features.function_references_enabled_;
    local_58.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_58.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_58.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_58.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_58.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_58.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    local_58.features.gc_enabled_ = s_features.gc_enabled_;
    local_58.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_58.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    local_58.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    local_58.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    local_58.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_58.stop_on_first_error = true;
    local_58.fail_on_custom_section_error = true;
    local_58.skip_function_bodies = false;
    out_module = (Module *)local_3c8;
    local_250 = &p_Stack_220;
    RVar4 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,local_468,
                               lStack_460 - (long)local_468,&local_58,&local_448,out_module);
    if (RVar4.enum_ == Ok) {
      local_4b8[0]._M_local_buf[0] = s_features.extended_const_enabled_;
      local_4b8[0]._M_local_buf[1] = s_features.relaxed_simd_enabled_;
      local_4c8._M_unused._M_member_pointer =
           CONCAT17(s_features.multi_value_enabled_,
                    CONCAT16(s_features.function_references_enabled_,
                             CONCAT15(s_features.threads_enabled_,
                                      CONCAT14(s_features.simd_enabled_,
                                               CONCAT13(s_features.sign_extension_enabled_,
                                                        CONCAT12(s_features.
                                                                 sat_float_to_int_enabled_,
                                                                 CONCAT11(s_features.
                                                                          mutable_globals_enabled_,
                                                                          s_features.
                                                                          exceptions_enabled_)))))))
      ;
      local_4c8._8_8_ =
           CONCAT17(s_features.multi_memory_enabled_,
                    CONCAT16(s_features.memory64_enabled_,
                             CONCAT15(s_features.gc_enabled_,
                                      CONCAT14(s_features.code_metadata_enabled_,
                                               CONCAT13(s_features.annotations_enabled_,
                                                        CONCAT12(s_features.reference_types_enabled_
                                                                 ,CONCAT11(s_features.
                                                                           bulk_memory_enabled_,
                                                                           s_features.
                                                                           tail_call_enabled_)))))))
      ;
      RVar5 = wabt::ValidateModule((Module *)local_3c8,&local_448,(ValidateOptions *)&local_4c8);
      RVar6 = wabt::GenerateNames((Module *)local_3c8,None);
      sVar16._M_str = s_write_c_options.module_name._M_str;
      sVar16._M_len = s_write_c_options.module_name._M_len;
      RVar4.enum_ = Error;
      if ((RVar5.enum_ != Error) && (s_write_c_options.module_name = sVar16, RVar6.enum_ != Error))
      {
        wabt::ApplyNames((Module *)local_3c8);
        sVar12 = s_outfile_abi_cxx11_._M_string_length;
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          wabt::FileStream::FileStream((FileStream *)&local_4c8,_stdout,(Stream *)0x0);
          RVar4 = wabt::WriteC((wabt *)local_4c8._M_pod_data,(Stream *)&local_4c8,(Stream *)"wasm.h"
                               ,local_3c8,(Module *)&s_write_c_options,(WriteCOptions *)out_module);
          wabt::FileStream::~FileStream((FileStream *)&local_4c8);
        }
        else {
          do {
            uVar11 = sVar12 - 1;
            if (sVar12 == 0) {
              uVar11 = 0xffffffffffffffff;
              break;
            }
            lVar2 = sVar12 - 1;
            sVar12 = uVar11;
          } while (s_outfile_abi_cxx11_._M_dataplus._M_p[lVar2] != '.');
          if (s_outfile_abi_cxx11_._M_string_length < uVar11) goto LAB_00114fc3;
          if ((s_outfile_abi_cxx11_._M_string_length - uVar11 != 2) ||
             (*(short *)(s_outfile_abi_cxx11_._M_dataplus._M_p + uVar11) != 0x632e)) {
            uVar11 = s_outfile_abi_cxx11_._M_string_length;
          }
          local_4c8._M_unused._M_object = local_4b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4c8,s_outfile_abi_cxx11_._M_dataplus._M_p,
                     s_outfile_abi_cxx11_._M_dataplus._M_p + uVar11);
          plVar8 = (long *)std::__cxx11::string::append(local_4c8._M_pod_data);
          plVar10 = plVar8 + 2;
          if ((long *)*plVar8 == plVar10) {
            local_478 = *plVar10;
            lStack_470 = plVar8[3];
            local_488 = &local_478;
          }
          else {
            local_478 = *plVar10;
            local_488 = (long *)*plVar8;
          }
          local_480 = plVar8[1];
          *plVar8 = (long)plVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_unused._0_8_ != local_4b8) {
            operator_delete(local_4c8._M_unused._M_object,
                            CONCAT17(local_4b8[0]._M_local_buf[7],
                                     CONCAT16(local_4b8[0]._M_local_buf[6],
                                              CONCAT15(local_4b8[0]._M_local_buf[5],
                                                       CONCAT14(local_4b8[0]._M_local_buf[4],
                                                                CONCAT13(local_4b8[0]._M_local_buf
                                                                         [3],CONCAT12(local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [2],CONCAT11(
                                                  local_4b8[0]._M_local_buf[1],
                                                  local_4b8[0]._M_local_buf[0]))))))) + 1);
          }
          _Var3._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
          sVar9 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
          filename._M_str = _Var3._M_p;
          filename._M_len = sVar9;
          wabt::FileStream::FileStream((FileStream *)&local_4c8,filename,(Stream *)0x0);
          filename_00._M_str = (char *)local_488;
          filename_00._M_len = local_480;
          wabt::FileStream::FileStream((FileStream *)&local_428,filename_00,(Stream *)0x0);
          filename_02._M_str = (char *)local_488;
          filename_02._M_len = local_480;
          sVar15 = wabt::GetBasename(filename_02);
          sVar17._M_str = s_write_c_options.module_name._M_str;
          sVar17._M_len = s_write_c_options.module_name._M_len;
          if (s_write_c_options.module_name._M_len == 0) {
            s_write_c_options.module_name._M_len = local_3c8._40_8_;
            s_write_c_options.module_name._M_str = (char *)local_3c8._32_8_;
            sVar17._M_str = (char *)local_3c8._32_8_;
            sVar17._M_len = local_3c8._40_8_;
            if (local_3c8._40_8_ == 0) {
              filename_03._M_str = s_infile_abi_cxx11_._M_dataplus._M_p;
              filename_03._M_len = s_infile_abi_cxx11_._M_string_length;
              sVar16 = wabt::GetBasename(filename_03);
              filename_01._M_str = sVar16._M_str;
              filename_01._M_len = (size_t)filename_01._M_str;
              sVar17 = wabt::StripExtension((wabt *)sVar16._M_len,filename_01);
            }
          }
          local_3e8[0] = (Stream *)local_3d8;
          s_write_c_options.module_name = sVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3e8,sVar15._M_str,sVar15._M_str + sVar15._M_len);
          RVar4 = wabt::WriteC((wabt *)local_4c8._M_pod_data,(Stream *)&local_428,local_3e8[0],
                               local_3c8,(Module *)&s_write_c_options,(WriteCOptions *)out_module);
          if (local_3e8[0] != (Stream *)local_3d8) {
            operator_delete(local_3e8[0],local_3d8._0_8_ + 1);
          }
          wabt::FileStream::~FileStream((FileStream *)&local_428);
          wabt::FileStream::~FileStream((FileStream *)&local_4c8);
          if (local_488 != &local_478) {
            operator_delete(local_488,local_478 + 1);
          }
        }
      }
    }
    local_4c8._8_8_ = (_Any_data *)0x0;
    local_4b8[0]._M_local_buf[0] = '\0';
    local_4c8._M_unused._M_object = local_4b8;
    wabt::FormatErrorsToFile
              (&local_448,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_4c8,Never,
               0x50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_unused._0_8_ != local_4b8) {
      operator_delete(local_4c8._M_unused._M_object,
                      CONCAT17(local_4b8[0]._M_local_buf[7],
                               CONCAT16(local_4b8[0]._M_local_buf[6],
                                        CONCAT15(local_4b8[0]._M_local_buf[5],
                                                 CONCAT14(local_4b8[0]._M_local_buf[4],
                                                          CONCAT13(local_4b8[0]._M_local_buf[3],
                                                                   CONCAT12(local_4b8[0].
                                                                            _M_local_buf[2],
                                                                            CONCAT11(local_4b8[0].
                                                                                     _M_local_buf[1]
                                                                                     ,local_4b8[0].
                                                                                      _M_local_buf
                                                                                      [0]))))))) + 1
                     );
    }
    wabt::Module::~Module((Module *)local_3c8);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_448);
    uVar13 = (uint)(RVar4.enum_ != Ok);
  }
  if (local_468 != (void *)0x0) {
    operator_delete(local_468,local_458 - (long)local_468);
  }
  return uVar13;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name_full =
              std::string(strip_extension(s_outfile)) + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name_full);
          std::string_view header_name = GetBasename(header_name_full);
          if (s_write_c_options.module_name.empty()) {
            s_write_c_options.module_name = module.name;
            if (s_write_c_options.module_name.empty()) {
              // In the absence of module name in the names section use the
              // filename.
              s_write_c_options.module_name =
                  StripExtension(GetBasename(s_infile));
            }
          }
          result =
              WriteC(&c_stream, &h_stream, std::string(header_name).c_str(),
                     &module, s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}